

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O3

bool mg::fs::write_file(char *path,string_view *data)

{
  int __fd;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  __fd = open(path,0x242,0x1a4);
  if (__fd == -1) {
    write_file((fs *)path);
    bVar5 = false;
  }
  else {
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00104d40;
    *(int *)&this[1]._vptr__Sp_counted_base = __fd;
    this[1]._M_use_count = 0;
    this[1]._M_weak_count = 0;
    uVar3 = data->_M_len;
    uVar4 = 0;
    do {
      sVar2 = write(__fd,data->_M_str + uVar4,uVar3 - uVar4);
      iVar1 = (int)sVar2;
      bVar5 = iVar1 != -1;
      if (iVar1 == -1) {
        write_file((fs *)path);
        break;
      }
      uVar4 = uVar4 + (long)iVar1;
      uVar3 = data->_M_len;
    } while (uVar4 < uVar3);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return bVar5;
}

Assistant:

bool write_file(const char *path, const std::string_view &data) {
  // Open file
  const int fd = open(path, O_RDWR | O_CREAT | O_TRUNC, 0644);
  if (fd == -1) {
    fprintf(stderr, "Failed to open '%s' - %s\n", path, strerror(errno));
    return false;
  }
  std::shared_ptr<void> _defer_close_fd(nullptr, [=](...) { close(fd); });

  size_t total_bytes_written = 0;
  do {
    int wrote_bytes = write(fd, &data[total_bytes_written],
                            data.size() - total_bytes_written);
    if (wrote_bytes == -1) {
      fprintf(stderr, "Failed to write '%s' - %s\n", path, strerror(errno));
      return false;
    }
    total_bytes_written += wrote_bytes;
  } while (total_bytes_written < data.size());

  return true;
}